

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O0

bool crnlib::string_to_uint(char **pBuf,uint *value)

{
  int iVar1;
  bool bVar2;
  uint c;
  uint result2;
  uint result8;
  uint result;
  char *p;
  uint *value_local;
  char **pBuf_local;
  
  *value = 0;
  _result8 = *pBuf;
  while( true ) {
    bVar2 = false;
    if (*_result8 != '\0') {
      iVar1 = isspace((int)*_result8);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    _result8 = _result8 + 1;
  }
  result2 = 0;
  iVar1 = isdigit((int)*_result8);
  if (iVar1 != 0) {
    while( true ) {
      bVar2 = false;
      if (*_result8 != '\0') {
        iVar1 = isdigit((int)*_result8);
        bVar2 = iVar1 != 0;
      }
      if (!bVar2) {
        *value = result2;
        *pBuf = _result8;
        return true;
      }
      if ((result2 & 0xe0000000) != 0) {
        return false;
      }
      if (result2 * -8 - 1 < result2 * 2) {
        return false;
      }
      if (result2 * -10 - 1 < (int)*_result8 - 0x30U) break;
      result2 = ((int)*_result8 - 0x30U) + result2 * 10;
      _result8 = _result8 + 1;
    }
  }
  return false;
}

Assistant:

bool string_to_uint(const char*& pBuf, uint& value)
    {
        value = 0;

        CRNLIB_ASSERT(pBuf);
        const char* p = pBuf;

        while (*p && isspace(*p))
        {
            p++;
        }

        uint result = 0;

        if (!isdigit(*p))
        {
            return false;
        }

        while (*p && isdigit(*p))
        {
            if (result & 0xE0000000U)
            {
                return false;
            }

            const uint result8 = result << 3U;
            const uint result2 = result << 1U;

            if (result2 > (0xFFFFFFFFU - result8))
            {
                return false;
            }

            result = result8 + result2;

            uint c = p[0] - '0';
            if (c > (0xFFFFFFFFU - result))
            {
                return false;
            }

            result += c;

            p++;
        }

        value = result;

        pBuf = p;

        return true;
    }